

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCopyDatabase::Deserialize(LogicalCopyDatabase *this,Deserializer *deserializer)

{
  int iVar1;
  LogicalCopyDatabase *this_00;
  pointer *__ptr;
  ParseInfo *pPVar2;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_28;
  ParseInfo *local_20;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"info");
  pPVar2 = (ParseInfo *)0x0;
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar2 = (ParseInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParseInfo::Deserialize((ParseInfo *)&local_20,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pPVar2 = local_20;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalCopyDatabase *)operator_new(0x70);
  local_28._M_head_impl = pPVar2;
  LogicalCopyDatabase(this_00,(unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
                               *)&local_28);
  if (local_28._M_head_impl != (ParseInfo *)0x0) {
    (*(local_28._M_head_impl)->_vptr_ParseInfo[1])();
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCopyDatabase::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCopyDatabase>(new LogicalCopyDatabase(std::move(info)));
	return std::move(result);
}